

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-bitflag.c
# Opt level: O1

_Bool flag_has_dbg(bitflag *flags,size_t size,int flag,char *fi,char *fl)

{
  uint uVar1;
  ulong uVar2;
  _Bool _Var3;
  
  uVar1 = 1 << ((byte)(flag + -1) & 7);
  if (flag == 0) {
    _Var3 = false;
  }
  else {
    uVar2 = (ulong)(long)(flag + -1) >> 3;
    if (size <= uVar2) {
      quit_fmt("Error in flag_has(%s, %s): FlagID[%d] Size[%u] FlagOff[%u] FlagBV[%d]\n",fi,fl,flag,
               size & 0xffffffff,(ulong)(uint)(flag + -1 >> 3),uVar1);
    }
    _Var3 = (uVar1 & flags[uVar2]) != 0;
  }
  return _Var3;
}

Assistant:

bool flag_has_dbg(const bitflag *flags, const size_t size, const int flag,
				  const char *fi, const char *fl)
{
	const size_t flag_offset = FLAG_OFFSET(flag);
	const int flag_binary = FLAG_BINARY(flag);

	if (flag == FLAG_END) return false;

	if (flag_offset >= size) {
		quit_fmt("Error in flag_has(%s, %s): FlagID[%d] Size[%u] FlagOff[%u] FlagBV[%d]\n",
		         fi, fl, flag, (unsigned int) size, (unsigned int) flag_offset, flag_binary);
	}

	if (flags[flag_offset] & flag_binary) return true;

	return false;
}